

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rifiuti.c
# Opt level: O1

int main(int argc,char **argv)

{
  long lVar1;
  uchar uVar2;
  uint uVar3;
  uchar *puVar4;
  int64_t win_filetime;
  bool bVar5;
  _Bool _Var6;
  uint uVar7;
  GQuark GVar8;
  exitcode eVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  int iVar12;
  undefined8 uVar13;
  GError *pGVar14;
  FILE *__stream;
  uint *__ptr;
  size_t sVar15;
  int *piVar16;
  long lVar17;
  void *pvVar18;
  long lVar19;
  GDateTime *pGVar20;
  long lVar21;
  long *plVar22;
  size_t sVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  long *plVar26;
  char *pcVar27;
  GError **__filename;
  ulong uVar28;
  char *pcVar29;
  GError *error;
  long lStack_88;
  FILE *pFStack_80;
  void *pvStack_78;
  char *pcStack_70;
  undefined8 *puStack_68;
  long lStack_60;
  long lStack_58;
  long lStack_50;
  ulong uStack_48;
  GError *local_18;
  char **local_10;
  
  __filename = &local_18;
  local_18 = (GError *)0x0;
  pcVar27 = "INFO2";
  local_10 = argv;
  _Var6 = rifiuti_init(RECYCLE_BIN_TYPE_FILE,"INFO2","Parse INFO2 file and dump recycle bin data.",
                       &local_10,&local_18);
  if (!_Var6) {
LAB_00103c9c:
    eVar9 = rifiuti_cleanup(&local_18);
    return eVar9;
  }
  do_parse_records(_parse_record_cb);
  if ((meta->records->len == 0) && (iVar12 = g_hash_table_size(meta->invalid_records), iVar12 != 0))
  {
    GVar8 = rifiuti_fatal_error_quark();
    uVar13 = dcgettext(0,"No valid recycle bin record found",5);
    g_set_error_literal(&local_18,GVar8,1,uVar13);
    goto LAB_00103c9c;
  }
  _Var6 = dump_content(&local_18);
  if (_Var6) goto LAB_00103c9c;
  uVar3 = local_18->domain;
  uVar7 = g_file_error_quark();
  if (uVar3 == uVar7) {
    GVar8 = rifiuti_fatal_error_quark();
    uVar13 = g_strdup(local_18->message);
    pGVar14 = (GError *)g_error_new_literal(GVar8,2,uVar13);
    g_error_free(local_18);
    local_18 = pGVar14;
    goto LAB_00103c9c;
  }
  main_cold_1();
  lStack_88 = 0;
  uStack_48 = (ulong)uVar3;
  if ((__filename == (GError **)0x0) || (*(char *)__filename == '\0')) {
    g_return_if_fail_warning("rifiuti2","_validate_index_file","filename && *filename");
  }
  else {
    g_log("rifiuti2",0x80,"Start file validation for \'%s\'...",__filename);
    __stream = fopen((char *)__filename,"rb");
    if (__stream == (FILE *)0x0) {
      piVar16 = __errno_location();
      iVar12 = *piVar16;
      uVar10 = g_file_error_quark();
      uVar11 = g_file_error_from_errno(iVar12);
      uVar13 = dcgettext(0,"Can not open file: %s",5);
      uVar24 = g_strerror(iVar12);
      g_set_error(&lStack_88,uVar10,uVar11,uVar13,uVar24);
    }
    else {
      __ptr = (uint *)g_malloc(0x14);
      sVar15 = fread(__ptr,0x14,1,__stream);
      if (sVar15 == 0) {
        GVar8 = rifiuti_fatal_error_quark();
        uVar13 = dcgettext(0,"File is not an INFO2 index.",5);
        g_set_error_literal(&lStack_88,GVar8,1,uVar13);
      }
      else {
        uVar3 = *__ptr;
        uVar28 = (ulong)uVar3;
        if ((uVar3 & 0xfffffffd) == 0) {
          meta->total_entry = __ptr[2];
        }
        meta->recordsize = __ptr[3];
        g_free(__ptr);
        if (meta->recordsize == 800) {
          if ((uVar28 == 2) || (uVar3 == 5)) {
LAB_00103e94:
            rewind(__stream);
            meta->version = uVar28;
            bVar5 = true;
            goto LAB_00103f0b;
          }
LAB_00103ecf:
          GVar8 = rifiuti_fatal_error_quark();
          pcVar29 = "Illegal INFO2 version %u";
LAB_00103eec:
          g_set_error(&lStack_88,GVar8,1,pcVar29,uVar28);
        }
        else {
          if (meta->recordsize != 0x118) {
            GVar8 = rifiuti_fatal_error_quark();
            uVar28 = (ulong)meta->recordsize;
            pcVar29 = "Illegal INFO2 of record size %u";
            goto LAB_00103eec;
          }
          if ((5 < uVar3) || ((0x31U >> (uVar3 & 0x1f) & 1) == 0)) goto LAB_00103ecf;
          if (legacy_encoding != (char *)0x0) goto LAB_00103e94;
          uVar10 = g_option_error_quark();
          g_set_error_literal(&lStack_88,uVar10,2,
                              "This INFO2 file was produced on a legacy system without Unicode file name (Windows ME or earlier). Please specify codepage of concerned system with \'-l\' option."
                             );
        }
        __ptr = (uint *)0x0;
      }
      g_free(__ptr);
      fclose(__stream);
    }
  }
  __stream = (FILE *)0x0;
  bVar5 = false;
LAB_00103f0b:
  if (bVar5) {
    g_log("rifiuti2",0x80,"Start populating record for \'%s\'...",__filename);
    fseek(__stream,0x14,0);
    lVar17 = ftell(__stream);
    pvVar18 = (void *)g_malloc0(*(undefined4 *)(pcVar27 + 0x18));
    sVar15 = fread(pvVar18,1,(ulong)*(uint *)(pcVar27 + 0x18),__stream);
    lVar19 = lVar17;
    if (sVar15 != 0) {
      lStack_58 = (long)pvVar18 + 0x118;
      lVar21 = lVar17;
      pFStack_80 = __stream;
      pvStack_78 = pvVar18;
      pcStack_70 = pcVar27;
      do {
        lVar17 = ftell(__stream);
        pcVar29 = " (!!!)";
        if (sVar15 < *(uint *)(pcVar27 + 0x18)) {
          pcVar29 = "";
        }
        lStack_60 = lVar21;
        g_log("rifiuti2",0x80,"Read byte range %zu-%zu %s",lVar21,lVar17,pcVar29);
        if ((sVar15 < 0x118 && meta->recordsize == 0x118) ||
           (sVar15 < 0x119 && meta->recordsize == 800)) {
          lVar19 = 0;
        }
        else {
          lStack_50 = lVar17;
          lVar19 = g_malloc0(0x50);
          puStack_68 = (undefined8 *)g_string_new_len(pvVar18,0x104);
          *(undefined8 **)(lVar19 + 0x38) = puStack_68;
          *(undefined4 *)(lVar19 + 8) = *(undefined4 *)((long)pvVar18 + 0x104);
          g_log("rifiuti2",0x80,"index=%u");
          uVar3 = *(uint *)((long)pvVar18 + 0x108);
          g_log("rifiuti2",0x80,"drive=%u",uVar3);
          if (0x1a < uVar3) {
            GVar8 = rifiuti_record_error_quark();
            uVar13 = dcgettext(0,"Drive number %udoes not represent a valid drive",5);
            __stream = pFStack_80;
            g_set_error(lVar19 + 0x48,GVar8,0,uVar13,uVar3);
          }
          pvVar18 = pvStack_78;
          if (0x1a < uVar3) {
            uVar3 = 0x1b;
          }
          uVar2 = driveletters[uVar3];
          *(uchar *)(lVar19 + 0x44) = uVar2;
          *(undefined4 *)(lVar19 + 0x40) = 1;
          puVar4 = (uchar *)*puStack_68;
          if (*puVar4 == '\0') {
            *(undefined4 *)(lVar19 + 0x40) = 2;
            *puVar4 = uVar2;
          }
          win_filetime = *(int64_t *)((long)pvStack_78 + 0x10c);
          *(int64_t *)(lVar19 + 0x20) = win_filetime;
          pGVar20 = win_filetime_to_gdatetime(win_filetime);
          lVar17 = lStack_50;
          *(GDateTime **)(lVar19 + 0x18) = pGVar20;
          plVar26 = (long *)(lVar19 + 0x48);
          if (*(long *)(lVar19 + 0x48) == 0) {
            uVar13 = g_date_time_new_now_utc();
            lVar21 = g_date_time_difference(*(undefined8 *)(lVar19 + 0x18),uVar13);
            if ((0x1f540500 < lVar21) ||
               (iVar12 = g_date_time_get_year(*(undefined8 *)(lVar19 + 0x18)), iVar12 < 0x7cb)) {
              GVar8 = rifiuti_record_error_quark();
              uVar24 = dcgettext(0,"File deletion time is suspicious or broken",5);
              __stream = pFStack_80;
              g_set_error_literal(plVar26,GVar8,1,uVar24);
            }
            g_date_time_unref(uVar13);
            pvVar18 = pvStack_78;
          }
          *(undefined4 *)(lVar19 + 0x28) = *(undefined4 *)((long)pvVar18 + 0x114);
          g_log("rifiuti2",0x80,"filesize=%lu",*(undefined8 *)(lVar19 + 0x28));
          pcVar27 = pcStack_70;
          if (legacy_encoding != (char *)0x0) {
            lVar21 = g_convert(*puStack_68,0xffffffffffffffff,"UTF-8",legacy_encoding,0,0,0);
            if (lVar21 == 0) {
              GVar8 = rifiuti_record_error_quark();
              uVar13 = dcgettext(0,
                                 "Path contains character(s) that could not be interpreted in %s encoding"
                                 ,5);
              __stream = pFStack_80;
              g_set_error(plVar26,GVar8,3,uVar13,legacy_encoding);
            }
            else {
              g_free(lVar21);
            }
          }
          pvVar18 = pvStack_78;
          if (sVar15 != 0x118) {
            if ((sVar15 < 800) && (*plVar26 == 0)) {
              GVar8 = rifiuti_record_error_quark();
              uVar13 = dcgettext(0,"Record is truncated, thus unicode path might be incomplete",5);
              __stream = pFStack_80;
              g_set_error_literal(plVar26,GVar8,2,uVar13);
            }
            plVar22 = (long *)g_string_new_len(lStack_58,sVar15 - 0x118);
            *(long **)(lVar19 + 0x30) = plVar22;
            sVar23 = ucs2_bytelen((char *)*plVar22,plVar22[1]);
            if (*(long *)(lVar19 + 0x48) == 0) {
              lVar21 = g_convert(*plVar22,sVar23,"UTF-8","UTF-16LE",0,0,0);
              if (lVar21 == 0) {
                GVar8 = rifiuti_record_error_quark();
                uVar13 = dcgettext(0,"Path contains broken unicode character(s)",5);
                __stream = pFStack_80;
                g_set_error_literal(plVar26,GVar8,3,uVar13);
              }
              else {
                g_free(lVar21);
              }
            }
            pvVar18 = pvStack_78;
            pcVar27 = pcStack_70;
            if ((meta->fill_junk == false) && (uVar28 = plVar22[1], sVar23 < uVar28)) {
              if ((long)sVar23 < (long)uVar28) {
                lVar21 = *plVar22;
                do {
                  if (*(char *)(lVar21 + sVar23) != '\0') {
                    g_log("rifiuti2",0x80,"Junk detected at offset 0x%tx of unicode path",sVar23);
                    meta->fill_junk = true;
                    break;
                  }
                  lVar1 = lVar21 + sVar23;
                  sVar23 = sVar23 + 1;
                } while (lVar1 + 1U < uVar28 + lVar21);
              }
              pcVar27 = pcStack_70;
              if (meta->fill_junk == true) {
                hexdump((void *)*plVar22,plVar22[1]);
              }
            }
          }
        }
        if (lVar19 != 0) {
          g_ptr_array_add(*(undefined8 *)(pcVar27 + 0x28),lVar19);
        }
        sVar15 = fread(pvVar18,1,(ulong)*(uint *)(pcVar27 + 0x18),__stream);
        lVar21 = lVar17;
        lVar19 = lStack_60;
      } while (sVar15 != 0);
    }
    lStack_60 = lVar19;
    g_free(pvVar18);
    uVar13 = g_strdup_printf("|%zu|%zu",lStack_60,lVar17);
    iVar12 = feof(__stream);
    if ((iVar12 == 0) && (iVar12 = ferror(__stream), iVar12 != 0)) {
      uVar10 = g_file_error_quark();
      uVar24 = dcgettext(0,"Failed to read record for unknown reason",5);
      g_set_error_literal(&lStack_88,uVar10,0x18,uVar24);
    }
    if (lStack_88 != 0) {
      uVar24 = *(undefined8 *)(pcVar27 + 0x30);
      uVar25 = g_strdup(uVar13);
      g_hash_table_replace(uVar24,uVar25,lStack_88);
    }
    g_free(uVar13);
    iVar12 = fclose(__stream);
  }
  else {
    uVar13 = *(undefined8 *)(pcVar27 + 0x30);
    uVar24 = g_strdup(__filename);
    iVar12 = g_hash_table_replace(uVar13,uVar24,lStack_88);
  }
  return iVar12;
}

Assistant:

int
main (int    argc,
      char **argv)
{
    GError *error = NULL;

    UNUSED (argc);

    if (! rifiuti_init (
        RECYCLE_BIN_TYPE_FILE,
        N_("INFO2"),
        N_("Parse INFO2 file and dump recycle bin data."),
        &argv, &error
    ))
        goto cleanup;

    do_parse_records (&_parse_record_cb);

    if (! meta->records->len && g_hash_table_size (meta->invalid_records))
    {
        g_set_error_literal (&error, R2_FATAL_ERROR,
            R2_FATAL_ERROR_ILLEGAL_DATA,
            _("No valid recycle bin record found"));
        goto cleanup;
    }

    if (! dump_content (&error))
    {
        g_assert (error->domain == G_FILE_ERROR);
        GError *new_err = g_error_new_literal (
            R2_FATAL_ERROR, R2_FATAL_ERROR_TEMPFILE,
            g_strdup (error->message));
        g_error_free (error);
        error = new_err;
    }

    cleanup:

    return rifiuti_cleanup (&error);
}